

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edition_unittest.pb.cc
# Opt level: O3

uint8_t * __thiscall
edition_unittest::TestNestedMessageHasBits_NestedMessage::_InternalSerialize
          (TestNestedMessageHasBits_NestedMessage *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  anon_union_56_1_493b367e_for_TestNestedMessageHasBits_NestedMessage_3 *this_00;
  int *piVar1;
  int iVar2;
  int *piVar3;
  Value<google::protobuf::internal::GenericTypeHandler<edition_unittest::ForeignMessage>_> *value;
  uint8_t *puVar4;
  byte *pbVar5;
  ulong uVar6;
  ulong uVar7;
  int index;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  
  uVar9 = *(uint *)((long)&this->field_0 + 0x10);
  if (0 < (int)uVar9) {
    pbVar5 = stream->end_;
    if (pbVar5 <= target) {
      target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      pbVar5 = stream->end_;
    }
    if (pbVar5 <= target) {
      _InternalSerialize();
    }
    this_00 = &this->field_0;
    *target = 10;
    pbVar5 = target + 1;
    uVar8 = uVar9;
    if (0x7f < uVar9) {
      do {
        target = pbVar5;
        *target = (byte)uVar8 | 0x80;
        uVar9 = uVar8 >> 7;
        pbVar5 = target + 1;
        bVar10 = 0x3fff < uVar8;
        uVar8 = uVar9;
      } while (bVar10);
    }
    *pbVar5 = (byte)uVar9;
    if ((undefined1  [56])((undefined1  [56])*this_00 & (undefined1  [56])0x4) ==
        (undefined1  [56])0x0) {
      piVar3 = (int *)((long)&this->field_0 + 8);
      bVar10 = true;
    }
    else {
      piVar3 = (int *)google::protobuf::internal::LongSooRep::elements
                                ((LongSooRep *)&this_00->_impl_);
      bVar10 = (undefined1  [56])((undefined1  [56])*this_00 & (undefined1  [56])0x4) ==
               (undefined1  [56])0x0;
    }
    target = target + 2;
    iVar2 = google::protobuf::internal::SooRep::size((SooRep *)&this_00->_impl_,bVar10);
    piVar1 = piVar3 + iVar2;
    do {
      if (stream->end_ <= target) {
        target = google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      uVar6 = (ulong)*piVar3;
      uVar7 = uVar6;
      if (0x7f < uVar6) {
        do {
          *target = (byte)uVar7 | 0x80;
          uVar6 = uVar7 >> 7;
          target = target + 1;
          bVar10 = 0x3fff < uVar7;
          uVar7 = uVar6;
        } while (bVar10);
      }
      piVar3 = piVar3 + 1;
      *target = (byte)uVar6;
      target = target + 1;
    } while (piVar3 < piVar1);
  }
  iVar2 = *(int *)((long)&this->field_0 + 0x20);
  if (iVar2 != 0) {
    index = 0;
    do {
      value = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::internal::GenericTypeHandler<edition_unittest::ForeignMessage>>
                        (&(this->field_0)._impl_.nestedmessage_repeated_foreignmessage_.
                          super_RepeatedPtrFieldBase,index);
      target = google::protobuf::internal::WireFormatLite::InternalWriteMessage
                         (2,(MessageLite *)value,(value->field_0)._impl_._cached_size_.atom_,target,
                          stream);
      index = index + 1;
    } while (iVar2 != index);
  }
  uVar7 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar7 & 1) != 0) {
    puVar4 = google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((uVar7 & 0xfffffffffffffffe) + 8),target,stream);
    return puVar4;
  }
  return target;
}

Assistant:

::uint8_t* PROTOBUF_NONNULL TestNestedMessageHasBits_NestedMessage::_InternalSerialize(
    ::uint8_t* PROTOBUF_NONNULL target,
    ::google::protobuf::io::EpsCopyOutputStream* PROTOBUF_NONNULL stream) const {
  const TestNestedMessageHasBits_NestedMessage& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(serialize_to_array_start:edition_unittest.TestNestedMessageHasBits.NestedMessage)
  ::uint32_t cached_has_bits = 0;
  (void)cached_has_bits;

  // repeated int32 nestedmessage_repeated_int32 = 1;
  {
    int byte_size = this_._impl_._nestedmessage_repeated_int32_cached_byte_size_.Get();
    if (byte_size > 0) {
      target = stream->WriteInt32Packed(
          1, this_._internal_nestedmessage_repeated_int32(), byte_size, target);
    }
  }

  // repeated .edition_unittest.ForeignMessage nestedmessage_repeated_foreignmessage = 2;
  for (unsigned i = 0, n = static_cast<unsigned>(
                           this_._internal_nestedmessage_repeated_foreignmessage_size());
       i < n; i++) {
    const auto& repfield = this_._internal_nestedmessage_repeated_foreignmessage().Get(i);
    target =
        ::google::protobuf::internal::WireFormatLite::InternalWriteMessage(
            2, repfield, repfield.GetCachedSize(),
            target, stream);
  }

  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    target =
        ::_pbi::WireFormat::InternalSerializeUnknownFieldsToArray(
            this_._internal_metadata_.unknown_fields<::google::protobuf::UnknownFieldSet>(::google::protobuf::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:edition_unittest.TestNestedMessageHasBits.NestedMessage)
  return target;
}